

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

Gia_IsoMan_t * Gia_IsoManStart(Gia_Man_t *pGia)

{
  int iVar1;
  Gia_IsoMan_t *pGVar2;
  int *piVar3;
  word *pwVar4;
  Vec_Int_t *pVVar5;
  size_t __nmemb;
  
  pGVar2 = (Gia_IsoMan_t *)calloc(1,0x80);
  pGVar2->pGia = pGia;
  iVar1 = pGia->nObjs;
  __nmemb = (size_t)iVar1;
  pGVar2->nObjs = iVar1;
  pGVar2->nUniques = 1;
  pGVar2->nEntries = iVar1;
  piVar3 = (int *)calloc(__nmemb,4);
  pGVar2->pLevels = piVar3;
  piVar3 = (int *)calloc(__nmemb,4);
  pGVar2->pUniques = piVar3;
  pwVar4 = (word *)calloc(__nmemb,8);
  pGVar2->pStoreW = pwVar4;
  pVVar5 = Vec_IntAlloc(iVar1 / 4);
  pGVar2->vClasses = pVVar5;
  pVVar5 = Vec_IntAlloc(iVar1 / 4);
  pGVar2->vClasses2 = pVVar5;
  return pGVar2;
}

Assistant:

Gia_IsoMan_t * Gia_IsoManStart( Gia_Man_t * pGia )
{
    Gia_IsoMan_t * p;
    p = ABC_CALLOC( Gia_IsoMan_t, 1 );
    p->pGia      = pGia;
    p->nObjs     = Gia_ManObjNum( pGia );
    p->nUniques  = 1;
    p->nEntries  = p->nObjs;
    // internal data
    p->pLevels   = ABC_CALLOC( int, p->nObjs );
    p->pUniques  = ABC_CALLOC( int, p->nObjs );
    p->pStoreW   = ABC_CALLOC( word, p->nObjs );
    // class representation
    p->vClasses  = Vec_IntAlloc( p->nObjs/4 );
    p->vClasses2 = Vec_IntAlloc( p->nObjs/4 );
    return p;
}